

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O2

time_t license::seconds_from_epoch(char *timeString)

{
  int iVar1;
  size_t sVar2;
  invalid_argument *this;
  time_t tVar3;
  int day;
  int month;
  int year;
  tm tm;
  
  sVar2 = strlen(timeString);
  if (sVar2 != 10) {
    if (sVar2 == 8) {
      iVar1 = __isoc99_sscanf(timeString,"%4d%2d%2d",&year,&month,&day);
      if (iVar1 == 3) goto LAB_002a7963;
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Date not recognized");
    }
    else {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Date not recognized");
    }
LAB_002a79d8:
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar1 = __isoc99_sscanf(timeString,"%4d-%2d-%2d",&year,&month,&day);
  if (iVar1 != 3) {
    iVar1 = __isoc99_sscanf(timeString,"%4d/%2d/%2d",&year,&month,&day);
    if (iVar1 != 3) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Date not recognized");
      goto LAB_002a79d8;
    }
  }
LAB_002a7963:
  tm.tm_isdst = -1;
  tm.tm_year = year + -0x76c;
  tm.tm_mon = month + -1;
  tm.tm_mday = day;
  tm.tm_hour = 0;
  tm.tm_sec = 0;
  tm.tm_min = 0;
  tm.tm_wday = -1;
  tm.tm_yday = -1;
  tVar3 = mktime((tm *)&tm);
  return tVar3;
}

Assistant:

time_t seconds_from_epoch(const char* timeString) {
	int year, month, day;
	tm tm;
	if (strlen(timeString) == 8) {
		int nfield = sscanf(timeString, "%4d%2d%2d", &year, &month, &day);
		if (nfield != 3) {
			throw invalid_argument("Date not recognized");
		}
	} else if (strlen(timeString) == 10) {
		int nfield = sscanf(timeString, "%4d-%2d-%2d", &year, &month, &day);
		if (nfield != 3) {
			int nfield = sscanf(timeString, "%4d/%2d/%2d", &year, &month, &day);
			if (nfield != 3) {
				throw invalid_argument("Date not recognized");
			}
		}
	} else{
		throw invalid_argument("Date not recognized");
	}
	tm.tm_isdst = -1;
	tm.tm_year = year - 1900;
	tm.tm_mon = month - 1;
	tm.tm_mday = day;
	tm.tm_hour = 0;
	tm.tm_min = 0;
	tm.tm_sec = 0;
	tm.tm_yday = -1;
	tm.tm_wday = -1;
	return mktime(&tm);
}